

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

void Dau_DsdTest555(void)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  word *pwVar5;
  char *pcVar6;
  char cVar7;
  int w;
  long lVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  timespec ts_1;
  char pBuffer [2000];
  word Tru [2] [64];
  char pRes [2000];
  uint local_13fc;
  timespec local_13f8;
  long local_13e8;
  undefined8 local_13e0;
  timespec local_13d8 [125];
  word awStack_c08 [64];
  word local_a08 [64];
  char local_808 [2008];
  
  __stream = fopen("_npn/npn/dsd10.txt","rb");
  iVar1 = clock_gettime(3,local_13d8);
  if (iVar1 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_13d8[0].tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) +
            CONCAT71(local_13d8[0].tv_sec._1_7_,(char)local_13d8[0].tv_sec) * -1000000;
  }
  pcVar3 = fgets((char *)local_13d8,2000,__stream);
  if (pcVar3 == (char *)0x0) {
    dVar11 = 0.0;
    uVar9 = 0;
  }
  else {
    pcVar3 = (char *)0x0;
    local_13fc = 0;
    local_13e8 = lVar8;
    local_13e0 = __stream;
    do {
      sVar4 = strlen((char *)local_13d8);
      cVar7 = *(char *)((long)&local_13e0 + sVar4 + 7);
      if (cVar7 == '\n') {
        lVar8 = (long)&local_13e0 + 6;
        *(undefined1 *)((long)&local_13e0 + sVar4 + 7) = 0;
        cVar7 = *(char *)((long)&local_13e0 + sVar4 + 6);
      }
      else {
        lVar8 = (long)&local_13e0 + 7;
      }
      if (cVar7 == '\r') {
        *(undefined1 *)(lVar8 + sVar4) = 0;
      }
      if (((char)local_13d8[0].tv_sec != '\0') && ((char)local_13d8[0].tv_sec != 'V')) {
        pwVar5 = Dau_DsdToTruth((char *)((long)&local_13d8[0].tv_sec +
                                        (ulong)((char)local_13d8[0].tv_sec == '*')),10);
        lVar8 = 0;
        do {
          awStack_c08[lVar8] = pwVar5[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x10);
        lVar8 = 0;
        do {
          local_a08[lVar8] = pwVar5[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x10);
        iVar1 = clock_gettime(3,&local_13f8);
        if (iVar1 < 0) {
          lVar8 = 1;
        }
        else {
          lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_13f8.tv_nsec),8);
          lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_13f8.tv_sec * -1000000;
        }
        iVar1 = Dau_DsdDecompose(local_a08,10,0,1,local_808);
        iVar2 = clock_gettime(3,&local_13f8);
        if (iVar2 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_13f8.tv_nsec / 1000 + local_13f8.tv_sec * 1000000;
        }
        Dau_DsdNormalize(pcVar3);
        if (iVar1 != 0) {
          __assert_fail("nSizeNonDec == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0x814,"void Dau_DsdTest555()");
        }
        local_13fc = local_13fc + 1;
        pcVar3 = pcVar3 + lVar10 + lVar8;
        pwVar5 = Dau_DsdToTruth(local_808,10);
        __stream = local_13e0;
        lVar8 = 0;
        do {
          if (pwVar5[lVar8] != awStack_c08[lVar8]) {
            printf("%s -> %s \n",local_13d8,local_808);
            puts("Verification failed.");
            break;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x10);
      }
      pcVar6 = fgets((char *)local_13d8,2000,__stream);
    } while (pcVar6 != (char *)0x0);
    dVar11 = (double)(long)pcVar3;
    uVar9 = (ulong)local_13fc;
    lVar8 = local_13e8;
  }
  iVar1 = 0x88e437;
  printf("Finished trying %d decompositions.  ",uVar9);
  Abc_Print(iVar1,"%s =","Time");
  Abc_Print(iVar1,"%9.2f sec\n",dVar11 / 1000000.0);
  iVar2 = 3;
  iVar1 = clock_gettime(3,&local_13f8);
  if (iVar1 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_13f8.tv_nsec / 1000 + local_13f8.tv_sec * 1000000;
  }
  Abc_Print(iVar2,"%s =","Total");
  Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar10 + lVar8) / 1000000.0);
  dVar11 = (double)s_Times_0;
  Abc_Print(iVar2,"%s =","Time1");
  Abc_Print(iVar2,"%9.2f sec\n",dVar11 / 1000000.0);
  dVar11 = (double)s_Times_1;
  Abc_Print(iVar2,"%s =","Time2");
  Abc_Print(iVar2,"%9.2f sec\n",dVar11 / 1000000.0);
  dVar11 = (double)s_Times_2;
  Abc_Print(iVar2,"%s =","Time3");
  Abc_Print(iVar2,"%9.2f sec\n",dVar11 / 1000000.0);
  fclose(__stream);
  return;
}

Assistant:

void Dau_DsdTest555()
{
    int nVars = 10;
    int nWords = Abc_TtWordNum(nVars);
    char * pFileName = "_npn/npn/dsd10.txt";
    FILE * pFile = fopen( pFileName, "rb" );
    word Tru[2][DAU_MAX_WORD], * pTruth;
    char pBuffer[DAU_MAX_STR];
    char pRes[DAU_MAX_STR];
    int nSizeNonDec;
    int i, Counter = 0;
    abctime clk = Abc_Clock(), clkDec = 0, clk2;
//    return;

    while ( fgets( pBuffer, DAU_MAX_STR, pFile ) != NULL )
    {
        char * pStr2 = pBuffer + strlen(pBuffer)-1;
        if ( *pStr2 == '\n' )
            *pStr2-- = 0;
        if ( *pStr2 == '\r' )
            *pStr2-- = 0;
        if ( pBuffer[0] == 'V' || pBuffer[0] == 0 )
            continue;
        Counter++; 

        for ( i = 0; i < 1; i++ )
        {
//            Dau_DsdPermute( pBuffer );
            pTruth = Dau_DsdToTruth( pBuffer[0] == '*' ? pBuffer + 1 : pBuffer, nVars );
            Abc_TtCopy( Tru[0], pTruth, nWords, 0 );
            Abc_TtCopy( Tru[1], pTruth, nWords, 0 );
            clk2 = Abc_Clock();
            nSizeNonDec = Dau_DsdDecompose( Tru[1], nVars, 0, 1, pRes );
            clkDec += Abc_Clock() - clk2;
            Dau_DsdNormalize( pRes );
//            pStr2 = Dau_DsdPerform( t ); nSizeNonDec = 0;
            assert( nSizeNonDec == 0 );
            pTruth = Dau_DsdToTruth( pRes, nVars );
            if ( !Abc_TtEqual( pTruth, Tru[0], nWords ) )
            {
    //        Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );
    //        printf( "  " );
    //        Kit_DsdPrintFromTruth( (unsigned *)&t2, 6 );
                printf( "%s -> %s \n", pBuffer, pRes );
                printf( "Verification failed.\n" );
            }
        }
    }
    printf( "Finished trying %d decompositions.  ", Counter );
    Abc_PrintTime( 1, "Time", clkDec );
    Abc_PrintTime( 1, "Total", Abc_Clock() - clk );

    Abc_PrintTime( 1, "Time1", s_Times[0] );
    Abc_PrintTime( 1, "Time2", s_Times[1] );
    Abc_PrintTime( 1, "Time3", s_Times[2] );

    fclose( pFile );
}